

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

bool djgt_to_gl(djg_texture *texture,GLint target,GLint internalformat,bool immutable,bool mipmap,
               GLuint *gl)

{
  uint uVar1;
  GLsizei GVar2;
  PFNGLTEXIMAGE2DPROC p_Var3;
  PFNGLTEXSTORAGE1DPROC p_Var4;
  PFNGLTEXSTORAGE2DPROC p_Var5;
  PFNGLTEXSTORAGE3DPROC p_Var6;
  PFNGLTEXSUBIMAGE1DPROC p_Var7;
  GLuint *pGVar8;
  bool bVar9;
  bool bVar10;
  GLboolean GVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  GLenum GVar15;
  uint uVar16;
  undefined7 in_register_00000009;
  ulong uVar17;
  djg_texture *pdVar18;
  char *__ptr;
  ulong uVar19;
  GLenum GVar20;
  size_t sStackY_d0;
  GLuint glt;
  GLuint *local_90;
  GLint local_88 [12];
  GLint local_58 [10];
  
  uVar17 = CONCAT71(in_register_00000009,immutable);
  if ((texture == (djg_texture *)0x0) || (gl == (GLuint *)0x0)) {
    __assert_fail("texture && gl",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x46f,"bool djgt_to_gl(const djg_texture *, GLint, GLint, bool, bool, GLuint *)")
    ;
  }
  djgt__validate();
  iVar12 = djgt__count(texture);
  if (iVar12 == 0) {
    return false;
  }
  (*glad_glGenTextures)(1,&glt);
  (*glad_glBindTexture)(target,glt);
  p_Var5 = glad_glTexStorage2D;
  p_Var4 = glad_glTexStorage1D;
  p_Var3 = glad_glTexImage2D;
  local_90 = gl;
  if (target - 0x806fU < 2) {
    pdVar18 = texture->next;
    uVar16 = pdVar18->x;
    uVar1 = pdVar18->y;
    iVar12 = djgt__count(texture);
    p_Var6 = glad_glTexStorage3D;
    if (immutable) {
      iVar13 = djgt__mipcnt(uVar16,uVar1,iVar12);
      uVar17 = (ulong)uVar16;
      uVar19 = (ulong)uVar1;
      (*p_Var6)(target,iVar13,internalformat,uVar16,uVar1,iVar12);
    }
    else {
      uVar17 = (ulong)uVar16;
      uVar19 = (ulong)uVar1;
      (*glad_glTexImage3D)(target,0,internalformat,uVar16,uVar1,iVar12,0,0x1903,0x1401,(void *)0x0);
    }
    iVar13 = 0;
    bVar9 = true;
    while ((iVar13 < iVar12 && (bVar9 != false))) {
      bVar9 = djgt__glTexSubImage3D(pdVar18,target,iVar12,(GLint)uVar17,(GLint)uVar19);
      pdVar18 = pdVar18->next;
      iVar13 = iVar13 + 1;
    }
  }
  else if (target - 0x8c18U < 2) {
    pdVar18 = texture->next;
    uVar16 = pdVar18->x;
    if (immutable) {
      iVar12 = djgt__mipcnt(uVar16,0,0);
      iVar13 = djgt__count(texture);
      uVar17 = (ulong)uVar16;
      (*p_Var5)(target,iVar12,internalformat,uVar16,iVar13);
    }
    else {
      iVar12 = djgt__count(texture);
      uVar17 = (ulong)uVar16;
      (*p_Var3)(target,0,internalformat,uVar16,iVar12,0,0x1903,0x1401,(void *)0x0);
    }
    bVar9 = true;
    iVar12 = 0;
    while (pdVar18 != (djg_texture *)0x0) {
      pdVar18 = pdVar18->next;
      bVar10 = djgt__glTexSubImage2D(texture->next,target,iVar12,(GLint)uVar17);
      bVar9 = bVar9 != false && bVar10;
      iVar12 = iVar12 + 1;
    }
  }
  else if (target - 0x8c1aU < 2) {
    pdVar18 = texture->next;
    uVar16 = pdVar18->x;
    uVar1 = pdVar18->y;
    iVar12 = djgt__count(texture);
    p_Var6 = glad_glTexStorage3D;
    if (immutable) {
      iVar13 = djgt__mipcnt(uVar16,uVar1,0);
      uVar17 = (ulong)uVar16;
      uVar19 = (ulong)uVar1;
      (*p_Var6)(target,iVar13,internalformat,uVar16,uVar1,iVar12);
    }
    else {
      uVar17 = (ulong)uVar16;
      uVar19 = (ulong)uVar1;
      (*glad_glTexImage3D)(target,0,internalformat,uVar16,uVar1,iVar12,0,0x1903,0x1401,(void *)0x0);
    }
    bVar9 = true;
    iVar13 = 0;
    while ((iVar13 < iVar12 && (bVar9 != false))) {
      bVar9 = djgt__glTexSubImage3D(pdVar18,target,iVar13,(GLint)uVar17,(GLint)uVar19);
      pdVar18 = pdVar18->next;
      iVar13 = iVar13 + 1;
    }
  }
  else if (target == 0xde0) {
LAB_0013a570:
    iVar12 = texture->next->x;
    if (immutable) {
      iVar13 = djgt__mipcnt(iVar12,0,0);
      (*p_Var4)(target,iVar13,internalformat,iVar12);
    }
    else {
      (*glad_glTexImage1D)(target,0,internalformat,iVar12,0,0x1903,0x1401,(void *)0x0);
    }
    pdVar18 = texture->next;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[8] = 2;
    djgt__get_glpus(local_88);
    iVar12 = bcmp(local_58,local_88,0x24);
    if (iVar12 != 0) {
      djgt__set_glpus(local_58);
    }
    p_Var7 = glad_glTexSubImage1D;
    GVar2 = pdVar18->x;
    GVar15 = djgt__glformat(pdVar18->comp);
    uVar16 = pdVar18->pf - 1;
    GVar20 = 0x500;
    if (uVar16 < 4) {
      GVar20 = *(GLenum *)(&DAT_0019c740 + (ulong)uVar16 * 4);
    }
    (*p_Var7)(target,0,0,GVar2,GVar15,GVar20,pdVar18->texels);
    if (iVar12 != 0) {
      djgt__set_glpus(local_88);
    }
    djgt__validate();
    bVar9 = true;
  }
  else {
    if (target != 0xde1) {
      if (target == 0x8513) {
        pdVar18 = texture->next;
        uVar16 = pdVar18->x;
        iVar12 = pdVar18->y;
        if (immutable) {
          iVar13 = djgt__mipcnt(uVar16,iVar12,0);
          uVar17 = (ulong)uVar16;
          (*p_Var5)(0x8513,iVar13,internalformat,uVar16,iVar12);
        }
        else {
          iVar14 = 0;
          iVar13 = 6;
          while (bVar9 = iVar13 != 0, iVar13 = iVar13 + -1, bVar9) {
            uVar17 = (ulong)uVar16;
            (*glad_glTexImage2D)
                      (iVar14 + 0x8515,0,internalformat,uVar16,iVar12,0,0x1903,0x1401,(void *)0x0);
            iVar14 = iVar14 + 1;
          }
        }
        bVar9 = true;
        uVar16 = 0;
        while (((uVar16 < 6 && (pdVar18 != (djg_texture *)0x0)) && (bVar9 != false))) {
          bVar9 = djgt__glTexSubImage2D(pdVar18,uVar16 + 0x8515,0,(GLint)uVar17);
          pdVar18 = pdVar18->next;
          uVar16 = uVar16 + 1;
        }
        goto LAB_0013a85a;
      }
      if (((target != 0x8064) && (target != 0x84f5)) && (target != 0x84f7)) {
        if (target != 0x8063) {
          __ptr = "djg_error: Unsupported GL texture target\n";
          sStackY_d0 = 0x29;
          goto LAB_0013a8c1;
        }
        goto LAB_0013a570;
      }
    }
    iVar12 = texture->next->x;
    iVar13 = texture->next->y;
    if (immutable) {
      iVar14 = djgt__mipcnt(iVar12,iVar13,0);
      (*p_Var5)(target,iVar14,internalformat,iVar12,iVar13);
    }
    else {
      (*glad_glTexImage2D)(target,0,internalformat,iVar12,iVar13,0,0x1903,0x1401,(void *)0x0);
    }
    bVar9 = djgt__glTexSubImage2D(texture->next,target,0,iVar12);
  }
LAB_0013a85a:
  if ((mipmap) && (bVar9 != false)) {
    (*glad_glGenerateMipmap)(target);
  }
  bVar10 = djgt__validate();
  pGVar8 = local_90;
  if ((bVar10) && (bVar9 != false)) {
    GVar11 = (*glad_glIsTexture)(*local_90);
    if (GVar11 != '\0') {
      (*glad_glDeleteTextures)(1,pGVar8);
    }
    *pGVar8 = glt;
    return true;
  }
  __ptr = "djg_error: Caught OpenGL error\n";
  sStackY_d0 = 0x1f;
LAB_0013a8c1:
  fwrite(__ptr,sStackY_d0,1,_stdout);
  fflush(_stdout);
  return false;
}

Assistant:

DJGDEF bool
djgt_to_gl(
    const djg_texture *texture,
    GLint target,
    GLint internalformat,
    bool immutable,
    bool mipmap,
    GLuint *gl
) {
    bool v = true;
    GLuint glt;

    DJG_ASSERT(texture && gl);
    djgt__validate(); // flush previous OpenGL errors

    if (!djgt__count(texture)) return false;
    glGenTextures(1, &glt);
    glBindTexture(target, glt);
    switch (target) {
        /*************************************************************/
        /***/
        /***/
        // 1D
        case GL_TEXTURE_1D:
        case GL_PROXY_TEXTURE_1D: {
            int x = texture->next->x;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage1D(target,
                               djgt__mipcnt(x, 0, 0),
                               internalformat,
                               x);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage1D(target,
                    /*level*/0,
                             internalformat,
                             x,
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            djgt__glTexSubImage1D(texture->next, target, /*xoffset*/0);
        } break;

        /*************************************************************/
        /***/
        /***/
        // 1D_ARRAY
        case GL_TEXTURE_1D_ARRAY:
        case GL_PROXY_TEXTURE_1D_ARRAY: {
            int x = texture->next->x;
            int i = 0;
            const djg_texture *it = texture->next;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, 0, 0),
                               internalformat,
                               x,
                               djgt__count(texture));
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage2D(target,
                    /*level*/0,
                             internalformat,
                             x,
                             djgt__count(texture),
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            while (it) {
                it = it->next;
                v&= djgt__glTexSubImage2D(texture->next,
                                          target,
                               /*offsets*/0, i);
                ++i;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 2D
        case GL_TEXTURE_2D:
        case GL_TEXTURE_RECTANGLE:
        case GL_PROXY_TEXTURE_2D:
        case GL_PROXY_TEXTURE_RECTANGLE: {
            int x = texture->next->x;
            int y = texture->next->y;
#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage2D(target,
                    /*level*/0,
                             internalformat,
                             x,
                             y,
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            v&= djgt__glTexSubImage2D(texture->next, target, /*offsets*/0, 0);
        } break;

        /*************************************************************/
        /***/
        /***/
        // CUBEMAP
        case GL_TEXTURE_CUBE_MAP: {
            int x = texture->next->x;
            int y = texture->next->y;
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y);
            } else
#endif // NGL_ARB_texture_storage
            {
                for (i = 0; i < 6; ++i)
                    glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i,
                                 0, internalformat, x, y, 0,
                        /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < 6 && it && v; ++i) {
                v&= djgt__glTexSubImage2D(it,
                                          GL_TEXTURE_CUBE_MAP_POSITIVE_X + i,
                               /*offsets*/0, 0);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 2D_ARRAY
        case GL_TEXTURE_2D_ARRAY:
        case GL_PROXY_TEXTURE_2D_ARRAY: {
            int x = texture->next->x;
            int y = texture->next->y;
            int z = djgt__count(texture);
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage3D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y,
                               z);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage3D(target, 0, internalformat, x, y, z, 0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < z && v; ++i) {
                v&= djgt__glTexSubImage3D(it,
                                          target,
                               /*offsets*/0, 0, i);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 3D
        case GL_TEXTURE_3D:
        case GL_PROXY_TEXTURE_3D: {
            int x = texture->next->x;
            int y = texture->next->y;
            int z = djgt__count(texture);
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage3D(target,
                               djgt__mipcnt(x, y, z),
                               internalformat,
                               x,
                               y,
                               z);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage3D(target, 0, internalformat, x, y, z, 0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < z && v; ++i) {
                v&= djgt__glTexSubImage3D(it,
                                          target,
                               /*offsets*/0, 0, z);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // Error
        default:
            DJG_LOG("djg_error: Unsupported GL texture target\n");

            return false;
            break;
    }

    if (mipmap && v) glGenerateMipmap(target);

    if (!(v&= djgt__validate())) {
        DJG_LOG("djg_error: Caught OpenGL error\n");

        return false;
    }

    if (glIsTexture(*gl)) glDeleteTextures(1, gl);
    *gl = glt;

    return true;
}